

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

bool __thiscall despot::util::tinyxml::TiXmlPrinter::Visit(TiXmlPrinter *this,TiXmlUnknown *unknown)

{
  TiXmlString *this_00;
  Rep *pRVar1;
  size_t len;
  char *__s;
  
  DoIndent(this);
  this_00 = &this->buffer;
  TiXmlString::append(this_00,"<",1);
  __s = ((unknown->super_TiXmlNode).value.rep_)->str;
  len = strlen(__s);
  TiXmlString::append(this_00,__s,len);
  TiXmlString::append(this_00,">",1);
  pRVar1 = (this->lineBreak).rep_;
  TiXmlString::append(this_00,pRVar1->str,pRVar1->size);
  return true;
}

Assistant:

bool TiXmlPrinter::Visit(const TiXmlUnknown& unknown) {
	DoIndent();
	buffer += "<";
	buffer += unknown.Value();
	buffer += ">";
	DoLineBreak();
	return true;
}